

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.h
# Opt level: O0

bool __thiscall
dg::vr::VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::isIrrelevant
          (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *this,VREdge *edge)

{
  bool bVar1;
  VRLocation *loc;
  VREdge *in_RSI;
  DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *in_RDI;
  VRLocation *next;
  undefined7 in_stack_ffffffffffffffe0;
  bool bVar2;
  
  loc = getNextLocation(in_RDI,in_RSI);
  bVar2 = true;
  if (loc != (VRLocation *)0x0) {
    bVar1 = SimpleVisit::wasVisited((SimpleVisit *)in_RSI,loc);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = inOtherFunction((DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *)loc,
                              (VREdge *)CONCAT17(1,in_stack_ffffffffffffffe0));
    }
  }
  return bVar2;
}

Assistant:

bool isIrrelevant(VREdge *edge) const {
            VRLocation *next = getNextLocation(edge);
            return !next || Visit::wasVisited(next) || inOtherFunction(edge);
        }